

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

_Bool upb_Map_Delete(upb_Map *map,upb_MessageValue key,upb_MessageValue *val)

{
  _Bool _Var1;
  upb_value uStack_30;
  _Bool removed;
  upb_value v;
  upb_MessageValue *val_local;
  upb_Map *map_local;
  upb_MessageValue key_local;
  
  key_local.int64_val = key.str_val.size;
  map_local = key.map_val;
  v.val = (uint64_t)val;
  _Var1 = _upb_Map_Delete(map,&map_local,(long)map->key_size,&stack0xffffffffffffffd0);
  if (v.val != 0) {
    _upb_map_fromvalue(uStack_30,(void *)v.val,(long)map->val_size);
  }
  return _Var1;
}

Assistant:

bool upb_Map_Delete(upb_Map* map, upb_MessageValue key, upb_MessageValue* val) {
  upb_value v;
  const bool removed = _upb_Map_Delete(map, &key, map->key_size, &v);
  if (val) _upb_map_fromvalue(v, val, map->val_size);
  return removed;
}